

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedResourcesMax::Setup(AdvancedResourcesMax *this)

{
  memset(&this->m_program,0,0x134);
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_program = 0;
		memset(m_storage_buffer, 0, sizeof(m_storage_buffer));
		memset(m_uniform_buffer, 0, sizeof(m_uniform_buffer));
		memset(m_atomic_buffer, 0, sizeof(m_atomic_buffer));
		memset(m_texture_buffer, 0, sizeof(m_texture_buffer));
		memset(m_texture, 0, sizeof(m_texture));
		memset(m_image_buffer, 0, sizeof(m_image_buffer));
		memset(m_image, 0, sizeof(m_image));
		return NO_ERROR;
	}